

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nesintf.c
# Opt level: O0

UINT8 nes_r_mame(void *chip,UINT8 offset)

{
  NESAPU_INF *info;
  UINT8 offset_local;
  void *chip_local;
  
  if (offset < 0x20) {
    chip_local._7_1_ = nes_apu_read(*(void **)((long)chip + 8),offset);
  }
  else if ((*(long *)((long)chip + 0x18) == 0) || (*(char *)((long)chip + 0x28) != '\0')) {
    chip_local._7_1_ = '\0';
  }
  else {
    chip_local._7_1_ = nes_read_fds(*(void **)((long)chip + 0x18),offset);
  }
  return chip_local._7_1_;
}

Assistant:

static UINT8 nes_r_mame(void* chip, UINT8 offset)
{
	NESAPU_INF* info = (NESAPU_INF*)chip;
	
	if (offset < 0x20)	// NES APU
	{
		return nes_apu_read(info->chip_apu, offset);
	}
	else	// FDS
	{
#ifdef EC_NES_NSFP_FDS
		if (info->chip_fds != NULL && ! info->fds_disable)
			return nes_read_fds(info->chip_fds, offset);
#endif
		return 0x00;
	}
}